

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collation.cpp
# Opt level: O1

uint32_t icu_63::Collation::incThreeBytePrimaryByOffset
                   (uint32_t basePrimary,UBool isCompressible,int32_t offset)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  uVar3 = basePrimary >> 8 & 0xff;
  iVar1 = uVar3 + offset;
  uVar2 = (uint)(isCompressible == '\0');
  iVar6 = uVar2 * 3 + 0xfb;
  iVar4 = (int)((ulong)((long)(int)(uVar3 + offset + -2) * -0x7efdfbf7) >> 0x20) + iVar1 + -2;
  iVar5 = (iVar4 >> 7) - (iVar4 >> 0x1f);
  iVar4 = (basePrimary >> 0x10 & 0xff) + uVar2 * 2 + iVar5 + -4;
  return (iVar4 / iVar6) * 0x1000000 + (basePrimary & 0xff000000) |
         (iVar1 + iVar5 * -0xfe + -2) * 0x100 + 0x200U |
         (iVar4 % iVar6) * 0x10000 + (uint)(isCompressible != '\0') * 0x20000 + 0x20000;
}

Assistant:

uint32_t
Collation::incThreeBytePrimaryByOffset(uint32_t basePrimary, UBool isCompressible, int32_t offset) {
    // Extract the third byte, minus the minimum byte value,
    // plus the offset, modulo the number of usable byte values, plus the minimum.
    offset += ((int32_t)(basePrimary >> 8) & 0xff) - 2;
    uint32_t primary = (uint32_t)((offset % 254) + 2) << 8;
    offset /= 254;
    // Same with the second byte,
    // but reserve the PRIMARY_COMPRESSION_LOW_BYTE and high byte if necessary.
    if(isCompressible) {
        offset += ((int32_t)(basePrimary >> 16) & 0xff) - 4;
        primary |= (uint32_t)((offset % 251) + 4) << 16;
        offset /= 251;
    } else {
        offset += ((int32_t)(basePrimary >> 16) & 0xff) - 2;
        primary |= (uint32_t)((offset % 254) + 2) << 16;
        offset /= 254;
    }
    // First byte, assume no further overflow.
    return primary | ((basePrimary & 0xff000000) + (uint32_t)(offset << 24));
}